

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xor_example.c
# Opt level: O0

int main(int argc,char **argv)

{
  net_t *n_00;
  layer_t *plVar1;
  net_t *n;
  float rate;
  int i;
  char **argv_local;
  int argc_local;
  
  n_00 = net_create(5,1,4);
  plVar1 = fc_layer(2,2,3,0.5,0.0);
  net_add(n_00,plVar1);
  plVar1 = tanh_layer(2);
  net_add(n_00,plVar1);
  plVar1 = fc_layer(2,1,3,0.5,0.0);
  net_add(n_00,plVar1);
  plVar1 = sigmoid_layer(1);
  net_add(n_00,plVar1);
  plVar1 = mse_layer(1);
  net_add(n_00,plVar1);
  net_finish(n_00);
  for (n._4_4_ = 0; n._4_4_ < 3000; n._4_4_ = n._4_4_ + 1) {
    net_train(n_00,feed_data,10.0);
  }
  feed_data(n_00);
  net_forward(n_00);
  for (n._4_4_ = 0; n._4_4_ < 4; n._4_4_ = n._4_4_ + 1) {
    printf("input %f %f, output %f\n",(double)((*n_00->layer)->in).val[n._4_4_ << 1],
           (double)((*n_00->layer)->in).val[n._4_4_ * 2 + 1],
           (double)(n_00->layer[n_00->size + -1]->in).val[n._4_4_]);
  }
  net_destroy(n_00);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int i = 0;
	float rate = 10;

	net_t *n = net_create(5, TRAIN_SGD, 4);

	net_add(n, fc_layer(2, 2, FILLER_XAVIER, 0.5, 0));
	net_add(n, tanh_layer(2));
	net_add(n, fc_layer(2, 1, FILLER_XAVIER, 0.5, 0));
	net_add(n, sigmoid_layer(1));
	net_add(n, mse_layer(1));

	net_finish(n);

	for (i = 0; i < 3000; ++i)
	{
		//LOG("train with rate %f\n", rate);
		net_train(n, feed_data, rate);
	}

	feed_data(n);
	net_forward(n);
	for (i = 0; i < 4; ++i)
	{
		LOG("input %f %f, output %f\n", n->layer[0]->in.val[2 * i], n->layer[0]->in.val[2 * i + 1], LAST_LAYER(n)->in.val[i]);
	}

	net_destroy(n);

	return 0;
}